

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

XMLText * __thiscall tinyxml2::XMLDocument::NewText(XMLDocument *this,char *str)

{
  int iVar1;
  undefined4 extraout_var;
  XMLText *pXVar2;
  
  iVar1 = (*(this->_textPool).super_MemPool._vptr_MemPool[3])(&this->_textPool);
  pXVar2 = (XMLText *)CONCAT44(extraout_var,iVar1);
  (pXVar2->super_XMLNode)._document = this;
  (pXVar2->super_XMLNode)._parent = (XMLNode *)0x0;
  (pXVar2->super_XMLNode)._value._flags = 0;
  (pXVar2->super_XMLNode)._value._start = (char *)0x0;
  (pXVar2->super_XMLNode)._value._end = (char *)0x0;
  (pXVar2->super_XMLNode)._parseLineNum = 0;
  (pXVar2->super_XMLNode)._firstChild = (XMLNode *)0x0;
  (pXVar2->super_XMLNode)._lastChild = (XMLNode *)0x0;
  (pXVar2->super_XMLNode)._prev = (XMLNode *)0x0;
  (pXVar2->super_XMLNode)._next = (XMLNode *)0x0;
  (pXVar2->super_XMLNode)._userData = (void *)0x0;
  (pXVar2->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_0027ba58;
  pXVar2->_isCData = false;
  (pXVar2->super_XMLNode)._memPool = &(this->_textPool).super_MemPool;
  DynArray<tinyxml2::XMLNode_*,_10>::EnsureCapacity(&this->_unlinked,(this->_unlinked)._size + 1);
  iVar1 = (this->_unlinked)._size;
  (this->_unlinked)._mem[iVar1] = (XMLNode *)pXVar2;
  (this->_unlinked)._size = iVar1 + 1;
  StrPair::SetStr(&(pXVar2->super_XMLNode)._value,str,0);
  return pXVar2;
}

Assistant:

XMLText* XMLDocument::NewText( const char* str )
{
    XMLText* text = CreateUnlinkedNode<XMLText>( _textPool );
    text->SetValue( str );
    return text;
}